

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

bool check_all_vis_and_in_group(Am_Value *obj_list_value,Am_Object *group,bool want_in_sub)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  byte unaff_R15B;
  Am_Object obj_group;
  Am_Object obj;
  Am_Value_List grouped_objs;
  Am_Object local_48;
  Am_Value local_40;
  
  bVar1 = Am_Object::Valid(group);
  if (bVar1) {
    obj.data = (Am_Object_Data *)0x0;
    obj_group.data = (Am_Object_Data *)0x0;
    Am_Value::Am_Value(&local_40,obj_list_value);
    bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_40,true);
    Am_Value::~Am_Value(&local_40);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&grouped_objs);
      Am_Value_List::operator=(&grouped_objs,obj_list_value);
      Am_Value_List::Start(&grouped_objs);
      while( true ) {
        unaff_R15B = Am_Value_List::Last(&grouped_objs);
        if ((bool)unaff_R15B) break;
        in_value = Am_Value_List::Get(&grouped_objs);
        Am_Object::operator=(&obj,in_value);
        Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)&obj);
        Am_Object::operator=(&obj_group,&local_48);
        Am_Object::~Am_Object(&local_48);
        bVar2 = Am_Object::operator==(&obj_group,group);
        if (bVar2 == want_in_sub) break;
        Am_Value_List::Next(&grouped_objs);
      }
      Am_Value_List::~Am_Value_List(&grouped_objs);
    }
    Am_Object::~Am_Object(&obj_group);
    Am_Object::~Am_Object(&obj);
    if (bVar1) goto LAB_002406e4;
  }
  unaff_R15B = 0;
LAB_002406e4:
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool
check_all_vis_and_in_group(Am_Value obj_list_value, Am_Object group,
                           bool want_in_sub)
{
  if (group.Valid()) {
    Am_Object obj, obj_group;
    bool ret = Am_Valid_and_Visible_List_Or_Object(obj_list_value, true);
    if (ret) {
      //now check that none are in a sub-group
      Am_Value_List grouped_objs;
      grouped_objs = obj_list_value;
      for (grouped_objs.Start(); !grouped_objs.Last(); grouped_objs.Next()) {
        obj = grouped_objs.Get();
        obj_group = obj.Get_Owner();
        if ((obj_group == group) == want_in_sub)
          return false;
      }
      return true;
    }
  }
  return false;
}